

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O2

type __thiscall
llvm::
make_unique<llbuild::basic::DeviceAgnosticFileSystem,std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>>
          (llvm *this,
          unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          *args)

{
  FileSystem *pFVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x10);
  pFVar1 = (args->_M_t).
           super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
           .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
  (args->_M_t).
  super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
  *puVar2 = &PTR__DeviceAgnosticFileSystem_0022e188;
  puVar2[1] = pFVar1;
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<llbuild::basic::DeviceAgnosticFileSystem,_std::default_delete<llbuild::basic::DeviceAgnosticFileSystem>,_true,_true>
          )(__uniq_ptr_data<llbuild::basic::DeviceAgnosticFileSystem,_std::default_delete<llbuild::basic::DeviceAgnosticFileSystem>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}